

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O0

uint32_t ClampedAddSubtractFull_SSE2(uint32_t c0,uint32_t c1,uint32_t c2)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  undefined1 local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  __m128i b;
  __m128i V2;
  __m128i V1;
  __m128i C2;
  __m128i C1;
  __m128i C0;
  __m128i zero;
  uint32_t c2_local;
  uint32_t c1_local;
  uint32_t c0_local;
  
  local_f8 = (byte)c0;
  uStack_f7 = (byte)(c0 >> 8);
  uStack_f6 = (byte)(c0 >> 0x10);
  uStack_f5 = (byte)(c0 >> 0x18);
  local_118 = (byte)c1;
  uStack_117 = (byte)(c1 >> 8);
  uStack_116 = (byte)(c1 >> 0x10);
  uStack_115 = (byte)(c1 >> 0x18);
  local_138 = (byte)c2;
  uStack_137 = (byte)(c2 >> 8);
  uStack_136 = (byte)(c2 >> 0x10);
  uStack_135 = (byte)(c2 >> 0x18);
  b[1]._3_1_ = 0;
  b[1]._2_1_ = uStack_f7;
  b[1]._5_1_ = 0;
  b[1]._4_1_ = uStack_f6;
  b[1]._7_1_ = 0;
  b[1]._6_1_ = uStack_f5;
  uStack_86 = (ushort)uStack_117;
  uStack_84 = (ushort)uStack_116;
  uStack_82 = (ushort)uStack_115;
  C0[1]._3_1_ = 0;
  C0[1]._2_1_ = uStack_137;
  C0[1]._5_1_ = 0;
  C0[1]._4_1_ = uStack_136;
  C0[1]._7_1_ = 0;
  C0[1]._6_1_ = uStack_135;
  sVar1 = ((ushort)local_f8 + (ushort)local_118) - (ushort)local_138;
  sVar2 = (b[1]._2_2_ + uStack_86) - C0[1]._2_2_;
  sVar3 = (b[1]._4_2_ + uStack_84) - C0[1]._4_2_;
  sVar4 = (b[1]._6_2_ + uStack_82) - C0[1]._6_2_;
  return CONCAT13((0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4),
                  CONCAT12((0 < sVar3) * (sVar3 < 0x100) * (char)sVar3 - (0xff < sVar3),
                           CONCAT11((0 < sVar2) * (sVar2 < 0x100) * (char)sVar2 - (0xff < sVar2),
                                    (0 < sVar1) * (sVar1 < 0x100) * (char)sVar1 - (0xff < sVar1))));
}

Assistant:

static WEBP_INLINE uint32_t ClampedAddSubtractFull_SSE2(uint32_t c0,
                                                        uint32_t c1,
                                                        uint32_t c2) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i C0 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c0), zero);
  const __m128i C1 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c1), zero);
  const __m128i C2 = _mm_unpacklo_epi8(_mm_cvtsi32_si128((int)c2), zero);
  const __m128i V1 = _mm_add_epi16(C0, C1);
  const __m128i V2 = _mm_sub_epi16(V1, C2);
  const __m128i b = _mm_packus_epi16(V2, V2);
  return (uint32_t)_mm_cvtsi128_si32(b);
}